

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

VmConstant * EvaluateModule(InstructionVMEvalContext *ctx,VmModule *module)

{
  VmFunction *owner;
  bool bVar1;
  StackFrame *this;
  VmConstant *result;
  VmFunction *global;
  VmModule *module_local;
  InstructionVMEvalContext *ctx_local;
  
  owner = (module->functions).tail;
  ctx->hasError = false;
  InstructionVMEvalContext::Storage::Reserve(&ctx->heap,ctx,0,0x1000);
  ctx->heapSize = ctx->heapSize + 0x1000;
  this = InstructionVMEvalContext::get<InstructionVMEvalContext::StackFrame>(ctx);
  InstructionVMEvalContext::StackFrame::StackFrame(this,ctx->allocator,owner);
  ctx->globalFrame = this;
  SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::push_back
            (&ctx->stackFrames,&ctx->globalFrame);
  ctx_local = (InstructionVMEvalContext *)EvaluateFunction(ctx,owner);
  if ((ctx->hasError & 1U) == 0) {
    SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::pop_back(&ctx->stackFrames);
    bVar1 = SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
    if (!bVar1) {
      __assert_fail("ctx.stackFrames.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                    ,0xa0a,"VmConstant *EvaluateModule(InstructionVMEvalContext &, VmModule *)");
    }
  }
  else {
    ctx_local = (InstructionVMEvalContext *)0x0;
  }
  return (VmConstant *)ctx_local;
}

Assistant:

VmConstant* EvaluateModule(InstructionVMEvalContext &ctx, VmModule *module)
{
	VmFunction *global = module->functions.tail;

	ctx.hasError = false;

	ctx.heap.Reserve(ctx, 0, 4096);
	ctx.heapSize += 4096;

	ctx.globalFrame = new (ctx.get<InstructionVMEvalContext::StackFrame>()) InstructionVMEvalContext::StackFrame(ctx.allocator, global);
	ctx.stackFrames.push_back(ctx.globalFrame);

	VmConstant *result = EvaluateFunction(ctx, global);

	if(ctx.hasError)
		return NULL;

	ctx.stackFrames.pop_back();

	assert(ctx.stackFrames.empty());

	return result;
}